

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O3

QDebug operator<<(QDebug d,QAccessibleInterface *iface)

{
  char *pcVar1;
  _func_int **pp_Var2;
  char cVar3;
  Role role;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  storage_type *psVar8;
  long *in_RDX;
  char16_t *pcVar9;
  storage_type *psVar10;
  QTextStream *pQVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QDebugStateSaver saver;
  undefined1 local_98 [16];
  QArrayDataPointer<QString> local_88;
  QTextStream *local_70;
  QDebug local_68;
  undefined1 *local_60;
  undefined2 local_52;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_60,(QDebug *)iface);
  pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
  if (in_RDX == (long *)0x0) {
    QVar15.m_data = (storage_type *)0x1a;
    QVar15.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
    if (pQVar11[0x30] == (QTextStream)0x0) goto LAB_00581252;
  }
  else {
    pQVar11[0x30] = (QTextStream)0x0;
    QVar12.m_data = (storage_type *)0x15;
    QVar12.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
    }
    Qt::hex(pQVar11);
    QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,in_RDX);
    pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
    }
    Qt::dec(pQVar11);
    cVar3 = (**(code **)(*in_RDX + 0x10))();
    pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
    if (cVar3 == '\0') {
      QVar16.m_data = &DAT_00000008;
      QVar16.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar16);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
      }
    }
    else {
      QVar13.m_data = &DAT_00000006;
      QVar13.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
      }
      (**(code **)(*in_RDX + 0x60))(&local_50);
      pcVar9 = local_50.d.ptr;
      if (local_50.d.ptr == (char16_t *)0x0) {
        pcVar9 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)iface,(ulong)pcVar9);
      pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
      }
      QTextStream::operator<<(pQVar11,' ');
      if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
      QVar14.m_data = &DAT_00000005;
      QVar14.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
      }
      role = (**(code **)(*in_RDX + 0x78))();
      pcVar6 = qAccessibleRoleString(role);
      pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
      if (pcVar6 == (char *)0x0) {
        psVar10 = (storage_type *)0x0;
      }
      else {
        psVar8 = (storage_type *)0xffffffffffffffff;
        do {
          psVar10 = psVar8 + 1;
          pcVar1 = pcVar6 + 1 + (long)psVar8;
          psVar8 = psVar10;
        } while (*pcVar1 != '\0');
      }
      QVar17.m_data = psVar10;
      QVar17.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar17);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
      }
      QTextStream::operator<<(pQVar11,' ');
      if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
      }
      iVar4 = (**(code **)(*in_RDX + 0x50))();
      if (iVar4 != 0) {
        pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
        QVar18.m_data = (storage_type *)0x7;
        QVar18.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar18);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
        }
        iVar4 = (**(code **)(*in_RDX + 0x50))();
        QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,iVar4);
        pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
        if (pQVar11[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(pQVar11,' ');
          pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
        }
        QTextStream::operator<<(pQVar11,' ');
        if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
        }
      }
      lVar7 = (**(code **)(*in_RDX + 0x18))();
      if (lVar7 != 0) {
        pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
        QVar19.m_data = (storage_type *)0x4;
        QVar19.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar19);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_70 = (QTextStream *)iface->_vptr_QAccessibleInterface;
        if (local_70[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(local_70,' ');
          local_70 = (QTextStream *)iface->_vptr_QAccessibleInterface;
        }
        *(int *)(local_70 + 0x28) = *(int *)(local_70 + 0x28) + 1;
        (**(code **)(*in_RDX + 0x18))();
        operator<<((QDebug *)&local_68,(QObject *)&local_70);
        QDebug::~QDebug(&local_68);
        QDebug::~QDebug((QDebug *)&local_70);
      }
      local_88.d = (Data *)0x0;
      local_88.ptr = (QString *)0x0;
      local_88.size = 0;
      uVar5 = (**(code **)(*in_RDX + 0x80))();
      if ((uVar5 & 4) != 0) {
        local_50.d.d = (Data *)0x0;
        local_50.d.ptr = L"focusable";
        local_50.d.size = 9;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_50);
        QList<QString>::end((QList<QString> *)&local_88);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((uVar5 & 8) != 0) {
        local_50.d.d = (Data *)0x0;
        local_50.d.ptr = L"focused";
        local_50.d.size = 7;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_50);
        QList<QString>::end((QList<QString> *)&local_88);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((uVar5 & 2) != 0) {
        local_50.d.d = (Data *)0x0;
        local_50.d.ptr = L"selected";
        local_50.d.size = 8;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_50);
        QList<QString>::end((QList<QString> *)&local_88);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((uVar5 >> 0x11 & 1) != 0) {
        local_50.d.d = (Data *)0x0;
        local_50.d.ptr = L"invisible";
        local_50.d.size = 9;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_50);
        QList<QString>::end((QList<QString> *)&local_88);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (local_88.size != 0) {
        local_52 = 0x7c;
        QtPrivate::QStringList_join
                  ((QList_conflict *)&local_50,(QChar *)&local_88,(longlong)&local_52);
        pcVar9 = local_50.d.ptr;
        if (local_50.d.ptr == (char16_t *)0x0) {
          pcVar9 = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)iface,(ulong)pcVar9);
        if (((QTextStream *)iface->_vptr_QAccessibleInterface)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,' ');
        }
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((uVar5 >> 0x11 & 1) == 0) {
        pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
        QVar20.m_data = &DAT_00000005;
        QVar20.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar20);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_98._0_8_ = iface->_vptr_QAccessibleInterface;
        if (((Stream *)local_98._0_8_)->space == true) {
          QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
          local_98._0_8_ = iface->_vptr_QAccessibleInterface;
        }
        ((Stream *)local_98._0_8_)->ref = ((Stream *)local_98._0_8_)->ref + 1;
        local_50.d._0_16_ = (**(code **)(*in_RDX + 0x70))();
        operator<<((QDebug *)(local_98 + 8),(QRect *)local_98);
        QDebug::~QDebug((QDebug *)(local_98 + 8));
        QDebug::~QDebug((QDebug *)local_98);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    }
    QTextStream::operator<<((QTextStream *)iface->_vptr_QAccessibleInterface,')');
    pQVar11 = (QTextStream *)iface->_vptr_QAccessibleInterface;
    if (pQVar11[0x30] != (QTextStream)0x1) goto LAB_00581252;
  }
  QTextStream::operator<<(pQVar11,' ');
LAB_00581252:
  pp_Var2 = iface->_vptr_QAccessibleInterface;
  iface->_vptr_QAccessibleInterface = (_func_int **)0x0;
  *(_func_int ***)d.stream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)d.stream;
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug d, const QAccessibleInterface *iface)
{
    QDebugStateSaver saver(d);
    if (!iface) {
        d << "QAccessibleInterface(null)";
        return d;
    }
    d.nospace();
    d << "QAccessibleInterface(" << Qt::hex << (const void *) iface << Qt::dec;
    if (iface->isValid()) {
        d << " name=" << iface->text(QAccessible::Name) << ' ';
        d << "role=" << qAccessibleRoleString(iface->role()) << ' ';
        if (iface->childCount())
            d << "childc=" << iface->childCount() << ' ';
        if (iface->object()) {
            d << "obj=" << iface->object();
        }
        QStringList stateStrings;
        QAccessible::State st = iface->state();
        if (st.focusable)
            stateStrings << u"focusable"_s;
        if (st.focused)
            stateStrings << u"focused"_s;
        if (st.selected)
            stateStrings << u"selected"_s;
        if (st.invisible)
            stateStrings << u"invisible"_s;

        if (!stateStrings.isEmpty())
            d << stateStrings.join(u'|');

        if (!st.invisible)
            d << "rect=" << iface->rect();

    } else {
        d << " invalid";
    }
    d << ')';
    return d;
}